

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SliceBase.h
# Opt level: O0

uint64_t __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
hashString(SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this,uint64_t seed)

{
  uint8_t *input;
  XXH64_hash_t XVar1;
  size_t in_RDI;
  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *in_stack_ffffffffffffffe8;
  
  input = start((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x11cc6c);
  stringSliceLength(in_stack_ffffffffffffffe8);
  XVar1 = VELOCYPACK_XXH64(input,in_RDI,0x11cc8c);
  return XVar1;
}

Assistant:

inline uint64_t hashString(uint64_t seed = defaultSeed64) const noexcept {
    return VELOCYPACK_HASH(start(),
                           static_cast<std::size_t>(stringSliceLength()), seed);
  }